

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O0

Dsd_Node_t *
dsdKernelFindContainingComponent
          (Dsd_Manager_t *pDsdMan,Dsd_Node_t *pWhere,DdNode *Var,int *fPolarity)

{
  int iVar1;
  int local_3c;
  int i;
  Dsd_Node_t *pTemp;
  int *fPolarity_local;
  DdNode *Var_local;
  Dsd_Node_t *pWhere_local;
  Dsd_Manager_t *pDsdMan_local;
  
  if (pWhere->nDecs == 1) {
    pDsdMan_local = (Dsd_Manager_t *)0x0;
  }
  else {
    local_3c = 0;
    while( true ) {
      if (pWhere->nDecs <= local_3c) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdProc.c"
                      ,0x529,
                      "Dsd_Node_t *dsdKernelFindContainingComponent(Dsd_Manager_t *, Dsd_Node_t *, DdNode *, int *)"
                     );
      }
      pDsdMan_local = (Dsd_Manager_t *)((ulong)pWhere->pDecs[local_3c] & 0xfffffffffffffffe);
      iVar1 = Extra_bddSuppContainVar(pDsdMan->dd,*(DdNode **)&pDsdMan_local->nInputs,Var);
      if (iVar1 != 0) break;
      local_3c = local_3c + 1;
    }
    *fPolarity = (uint)(pDsdMan_local != (Dsd_Manager_t *)pWhere->pDecs[local_3c]);
  }
  return (Dsd_Node_t *)pDsdMan_local;
}

Assistant:

Dsd_Node_t * dsdKernelFindContainingComponent( Dsd_Manager_t * pDsdMan, Dsd_Node_t * pWhere, DdNode * Var, int * fPolarity )

{
    Dsd_Node_t * pTemp;
    int i;

//  assert( !Dsd_IsComplement( pWhere ) );
//  assert( Extra_bddSuppContainVar( pDsdMan->dd, pWhere->S, Var ) );

    if ( pWhere->nDecs == 1 )
        return NULL;

    for( i = 0; i < pWhere->nDecs; i++ )
    {
        pTemp = Dsd_Regular( pWhere->pDecs[i] );
        if ( Extra_bddSuppContainVar( pDsdMan->dd, pTemp->S, Var ) )
        {
            *fPolarity = (int)( pTemp != pWhere->pDecs[i] );
            return pTemp;
        }
    }
    assert( 0 );
    return NULL;
}